

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_math.c
# Opt level: O0

size_t ares_pow(size_t x,size_t y)

{
  undefined8 local_20;
  size_t res;
  size_t y_local;
  size_t x_local;
  
  local_20 = 1;
  y_local = x;
  for (res = y; res != 0; res = res >> 1) {
    if ((res & 1) != 0) {
      local_20 = local_20 * y_local;
    }
    y_local = y_local * y_local;
  }
  return local_20;
}

Assistant:

size_t ares_pow(size_t x, size_t y)
{
  size_t res = 1;

  while (y > 0) {
    /* If y is odd, multiply x with result */
    if (y & 1) {
      res = res * x;
    }

    /* y must be even now */
    y = y >> 1; /* y /= 2; */
    x = x * x;  /* x^2 */
  }

  return res;
}